

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::Statistics::print(Statistics *this)

{
  ulong uVar1;
  ostream *poVar2;
  void *pvVar3;
  ulong *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"  # transform nodes : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[0x12]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"    # objects       : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[0x13]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # triangle meshes : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RDI);
  poVar2 = std::operator<<(poVar2," ( ");
  uVar1 = in_RDI[2];
  auVar4._8_4_ = (int)(uVar1 >> 0x20);
  auVar4._0_8_ = uVar1;
  auVar4._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar4._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06
                     );
  poVar2 = std::operator<<(poVar2," MB )");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"    # triangles     : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[1]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # quad meshes     : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI[3]);
  poVar2 = std::operator<<(poVar2," ( ");
  uVar1 = in_RDI[5];
  auVar5._8_4_ = (int)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar5._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06
                     );
  poVar2 = std::operator<<(poVar2," MB )");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"    # quads         : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[4]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # subdiv meshes   : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI[6]);
  poVar2 = std::operator<<(poVar2," ( ");
  uVar1 = in_RDI[8];
  auVar6._8_4_ = (int)(uVar1 >> 0x20);
  auVar6._0_8_ = uVar1;
  auVar6._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar6._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06
                     );
  poVar2 = std::operator<<(poVar2," MB )");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"    # patches       : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[7]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # curve sets      : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI[9]);
  poVar2 = std::operator<<(poVar2," ( ");
  uVar1 = in_RDI[0xb];
  auVar7._8_4_ = (int)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar7._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06
                     );
  poVar2 = std::operator<<(poVar2," MB )");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"    # curves        : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[10]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # grid meshes     : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI[0xc]);
  poVar2 = std::operator<<(poVar2," ( ");
  uVar1 = in_RDI[0xe];
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar8._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06
                     );
  poVar2 = std::operator<<(poVar2," MB )");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"    # grids         : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[0xd]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # point sets      : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI[0xf]);
  poVar2 = std::operator<<(poVar2," ( ");
  uVar1 = in_RDI[0x11];
  auVar9._8_4_ = (int)(uVar1 >> 0x20);
  auVar9._0_8_ = uVar1;
  auVar9._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar9._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06
                     );
  poVar2 = std::operator<<(poVar2," MB )");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"    # points        : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[0x10]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # lights          : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[0x14]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # cameras         : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[0x15]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  # materials       : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[0x16]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SceneGraph::Statistics::print()
  {
    std::cout << "  # transform nodes : " << numTransformNodes << std::endl;
    std::cout << "    # objects       : " << numTransformedObjects << std::endl;
    std::cout << "  # triangle meshes : " << numTriangleMeshes << " ( " << 1E-6*numTriangleBytes << " MB )" << std::endl;
    std::cout << "    # triangles     : " << numTriangles << std::endl;
    std::cout << "  # quad meshes     : " << numQuadMeshes << " ( " << 1E-6*numQuadBytes << " MB )" << std::endl;
    std::cout << "    # quads         : " << numQuads << std::endl;
    std::cout << "  # subdiv meshes   : " << numSubdivMeshes << " ( " << 1E-6*numSubdivBytes << " MB )" << std::endl;
    std::cout << "    # patches       : " << numPatches << std::endl;
    std::cout << "  # curve sets      : " << numCurveSets << " ( " << 1E-6*numCurveBytes << " MB )" << std::endl;
    std::cout << "    # curves        : " << numCurves << std::endl;
    std::cout << "  # grid meshes     : " << numGridMeshNodes << " ( " << 1E-6*numGridBytes << " MB )" << std::endl;
    std::cout << "    # grids         : " << numGrids << std::endl;
    std::cout << "  # point sets      : " << numPointSets << " ( " << 1E-6*numPointBytes << " MB )" << std::endl;
    std::cout << "    # points        : " << numPoints << std::endl;
    std::cout << "  # lights          : " << numLights << std::endl;
    std::cout << "  # cameras         : " << numCameras << std::endl;
    std::cout << "  # materials       : " << numMaterials << std::endl;
  }